

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O1

void __thiscall cfd::SignParameter::SignParameter(SignParameter *this,Script *redeem_script)

{
  cfd::core::Script::GetData();
  this->data_type_ = kRedeemScript;
  cfd::core::Pubkey::Pubkey(&this->related_pubkey_);
  this->der_encode_ = false;
  cfd::core::SigHashType::SigHashType(&this->sighash_type_);
  cfd::core::ScriptOperator::ScriptOperator
            (&this->op_code_,(ScriptOperator *)&core::ScriptOperator::OP_INVALIDOPCODE);
  return;
}

Assistant:

SignParameter::SignParameter(const Script& redeem_script)
    : data_(redeem_script.GetData()),
      data_type_(SignDataType::kRedeemScript),
      related_pubkey_(),
      der_encode_(false),
      sighash_type_(),
      op_code_(ScriptOperator::OP_INVALIDOPCODE) {
  // do nothing
}